

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_enum.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::EnumGenerator::EnumGenerator
          (EnumGenerator *this,EnumDescriptor *descriptor,Options *options)

{
  bool in_CL;
  
  this->descriptor_ = descriptor;
  ClassName_abi_cxx11_(&this->classname_,(cpp *)descriptor,(EnumDescriptor *)0x0,in_CL);
  Options::Options(&this->options_,options);
  return;
}

Assistant:

EnumGenerator::EnumGenerator(const EnumDescriptor* descriptor,
                             const Options& options)
  : descriptor_(descriptor),
    classname_(ClassName(descriptor, false)),
    options_(options) {
}